

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partmap.hh
# Opt level: O0

vector<TrackedContext,_std::allocator<TrackedContext>_> * __thiscall
partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>::split
          (partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_> *this,
          Address *pnt)

{
  bool bVar1;
  reference ppVar2;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *newref;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *newref_1;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>
  local_28;
  iterator iter;
  Address *pnt_local;
  partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_> *this_local;
  
  iter._M_node = (_Base_ptr)pnt;
  std::
  _Rb_tree_iterator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>
  ::_Rb_tree_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
             ::upper_bound(&this->database,iter._M_node);
  local_28._M_node = local_30;
  newref_1 = (vector<TrackedContext,_std::allocator<TrackedContext>_> *)
             std::
             map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
             ::begin(&this->database);
  bVar1 = std::operator!=(&local_28,(_Self *)&newref_1);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>
    ::operator--(&local_28);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>
             ::operator*(&local_28);
    bVar1 = Address::operator==(&ppVar2->first,(Address *)iter._M_node);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>
               ::operator*(&local_28);
      this_local = (partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>
                    *)&ppVar2->second;
    }
    else {
      this_local = (partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>
                    *)std::
                      map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
                      ::operator[](&this->database,(key_type *)iter._M_node);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>
               ::operator*(&local_28);
      std::vector<TrackedContext,_std::allocator<TrackedContext>_>::operator=
                ((vector<TrackedContext,_std::allocator<TrackedContext>_> *)this_local,
                 &ppVar2->second);
    }
  }
  else {
    this_local = (partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_> *)
                 std::
                 map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
                 ::operator[](&this->database,(key_type *)iter._M_node);
    std::vector<TrackedContext,_std::allocator<TrackedContext>_>::operator=
              ((vector<TrackedContext,_std::allocator<TrackedContext>_> *)this_local,
               &this->defaultvalue);
  }
  return (vector<TrackedContext,_std::allocator<TrackedContext>_> *)this_local;
}

Assistant:

_valuetype &partmap<_linetype,_valuetype>::
  split(const _linetype &pnt)

  {
    iterator iter;
    
    iter = database.upper_bound(pnt);
    if (iter != database.begin()) {
      --iter;
      if ((*iter).first == pnt)	// point matches exactly
	return (*iter).second;	// Return old ref
      _valuetype &newref( database[pnt] ); // Create new ref at point
      newref = (*iter).second;	// Copy of original partition value
      return newref;
    }
    _valuetype &newref( database[pnt] ); // Create new ref at point
    newref = defaultvalue;	// Copy of defaultvalue
    return newref;
  }